

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortestSeparator
          (BytewiseComparatorImpl *this,string *start,Slice *limit)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  pointer pcVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  bool bVar11;
  pointer local_30;
  size_type local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = limit->size_;
  uVar8 = start->_M_string_length;
  if (uVar2 < start->_M_string_length) {
    uVar8 = uVar2;
  }
  bVar11 = uVar8 != 0;
  if (bVar11) {
    pcVar3 = (start->_M_dataplus)._M_p;
    if (*pcVar3 == *limit->data_) {
      uVar10 = 0;
      do {
        if (uVar8 - 1 == uVar10) goto LAB_00662ba8;
        lVar5 = uVar10 + 1;
        uVar9 = uVar10 + 1;
        lVar6 = uVar10 + 1;
        uVar10 = uVar9;
      } while (pcVar3[lVar5] == limit->data_[lVar6]);
      bVar11 = uVar9 < uVar8;
    }
    else {
      uVar9 = 0;
    }
    if (bVar11) {
      pcVar4 = (start->_M_dataplus)._M_p;
      bVar1 = pcVar4[uVar9];
      if (bVar1 != 0xff) {
        if (uVar2 <= uVar9) {
          __assert_fail("n < size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/include/leveldb/slice.h"
                        ,0x3a,"char leveldb::Slice::operator[](size_t) const");
        }
        if (bVar1 + 1 < (uint)(byte)limit->data_[uVar9]) {
          pcVar4[uVar9] = bVar1 + 1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
                    (start,uVar9 + 1,'\0');
          local_30 = (start->_M_dataplus)._M_p;
          local_28 = start->_M_string_length;
          iVar7 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_30,limit);
          if (-1 < iVar7) {
            __assert_fail("Compare(*start, limit) < 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/util/comparator.cc"
                          ,0x31,
                          "virtual void leveldb::(anonymous namespace)::BytewiseComparatorImpl::FindShortestSeparator(std::string *, const Slice &) const"
                         );
          }
        }
      }
    }
  }
LAB_00662ba8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FindShortestSeparator(std::string* start,
                             const Slice& limit) const override {
    // Find length of common prefix
    size_t min_length = std::min(start->size(), limit.size());
    size_t diff_index = 0;
    while ((diff_index < min_length) &&
           ((*start)[diff_index] == limit[diff_index])) {
      diff_index++;
    }

    if (diff_index >= min_length) {
      // Do not shorten if one string is a prefix of the other
    } else {
      uint8_t diff_byte = static_cast<uint8_t>((*start)[diff_index]);
      if (diff_byte < static_cast<uint8_t>(0xff) &&
          diff_byte + 1 < static_cast<uint8_t>(limit[diff_index])) {
        (*start)[diff_index]++;
        start->resize(diff_index + 1);
        assert(Compare(*start, limit) < 0);
      }
    }
  }